

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

Abc_Obj_t * Abc_BufFindNonBuffDriver(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *local_20;
  Abc_Obj_t *pObj_local;
  Buf_Man_t *p_local;
  
  iVar1 = Abc_ObjIsNode(pObj);
  local_20 = pObj;
  if ((iVar1 != 0) && (iVar1 = Abc_NodeIsBuf(pObj), iVar1 != 0)) {
    pObj_00 = Abc_ObjFanin0(pObj);
    local_20 = Abc_BufFindNonBuffDriver(p,pObj_00);
  }
  return local_20;
}

Assistant:

Abc_Obj_t * Abc_BufFindNonBuffDriver( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    return (Abc_ObjIsNode(pObj) && Abc_NodeIsBuf(pObj)) ? Abc_BufFindNonBuffDriver(p, Abc_ObjFanin0(pObj)) : pObj;
}